

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoverSymbols.cpp
# Opt level: O3

void __thiscall
slang::ast::CoverageBinSymbol::TransRangeList::TransRangeList
          (TransRangeList *this,TransRangeSyntax *syntax,Type *type,ASTContext *context)

{
  TokenKind TVar1;
  TransRepeatRangeSyntax *pTVar2;
  SelectorSyntax *pSVar3;
  int iVar4;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar5;
  undefined4 extraout_var;
  Expression *pEVar6;
  RepeatKind RVar7;
  Type *extraout_RDX;
  Type *src;
  size_t extraout_RDX_00;
  RangeSelectSyntax *rss;
  ulong uVar8;
  long lVar9;
  SmallVector<const_slang::ast::Expression_*,_5UL> buffer;
  Expression *local_78;
  SmallVectorBase<const_slang::ast::Expression_*> local_70 [2];
  
  this->repeatFrom = (Expression *)0x0;
  this->repeatTo = (Expression *)0x0;
  (this->items)._M_ptr = (pointer)0x0;
  (this->items)._M_extent._M_extent_value = 0;
  this->repeatKind = None;
  local_70[0].data_ = (pointer)local_70[0].firstElement;
  local_70[0].len = 0;
  local_70[0].cap = 5;
  uVar8 = (syntax->items).elements._M_extent._M_extent_value + 1;
  src = type;
  if (1 < uVar8) {
    uVar8 = uVar8 >> 1;
    lVar9 = 0;
    do {
      ppSVar5 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                          ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                           ((long)&(((syntax->items).elements._M_ptr)->super_ConstTokenOrSyntax).
                                   super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                           + lVar9));
      local_78 = bindCovergroupExpr((ExpressionSyntax *)*ppSVar5,context,type,
                                    (bitmask<slang::ast::ASTFlags>)0x0);
      SmallVectorBase<slang::ast::Expression_const*>::emplace_back<slang::ast::Expression_const*>
                ((SmallVectorBase<slang::ast::Expression_const*> *)local_70,&local_78);
      lVar9 = lVar9 + 0x30;
      uVar8 = uVar8 - 1;
      src = extraout_RDX;
    } while (uVar8 != 0);
  }
  iVar4 = SmallVectorBase<const_slang::ast::Expression_*>::copy
                    (local_70,(EVP_PKEY_CTX *)((context->scope).ptr)->compilation,
                     (EVP_PKEY_CTX *)src);
  (this->items)._M_ptr = (pointer)CONCAT44(extraout_var,iVar4);
  (this->items)._M_extent._M_extent_value = extraout_RDX_00;
  pTVar2 = syntax->repeat;
  if (pTVar2 != (TransRepeatRangeSyntax *)0x0) {
    TVar1 = (pTVar2->specifier).kind;
    if (TVar1 == Star) {
      RVar7 = Consecutive;
    }
    else if (TVar1 == MinusArrow) {
      RVar7 = GoTo;
    }
    else {
      RVar7 = Nonconsecutive;
    }
    this->repeatKind = RVar7;
    pSVar3 = pTVar2->selector;
    if (pSVar3 != (SelectorSyntax *)0x0) {
      if ((pSVar3->super_SyntaxNode).kind == BitSelect) {
        pEVar6 = bindCovergroupExpr(*(ExpressionSyntax **)&pSVar3[1].super_SyntaxNode,context,
                                    (Type *)0x0,(bitmask<slang::ast::ASTFlags>)0x0);
        ASTContext::requireIntegral(context,pEVar6);
        this->repeatFrom = pEVar6;
      }
      else {
        pEVar6 = bindCovergroupExpr(*(ExpressionSyntax **)&pSVar3[1].super_SyntaxNode,context,
                                    (Type *)0x0,(bitmask<slang::ast::ASTFlags>)0x0);
        ASTContext::requireIntegral(context,pEVar6);
        this->repeatFrom = pEVar6;
        pEVar6 = bindCovergroupExpr(*(ExpressionSyntax **)&pSVar3[2].super_SyntaxNode,context,
                                    (Type *)0x0,(bitmask<slang::ast::ASTFlags>)0x0);
        ASTContext::requireIntegral(context,pEVar6);
        this->repeatTo = pEVar6;
      }
    }
  }
  if (local_70[0].data_ != (pointer)local_70[0].firstElement) {
    operator_delete(local_70[0].data_);
  }
  return;
}

Assistant:

CoverageBinSymbol::TransRangeList::TransRangeList(const TransRangeSyntax& syntax, const Type& type,
                                                  const ASTContext& context) {
    SmallVector<const Expression*> buffer;
    for (auto elem : syntax.items) {
        auto& expr = bindCovergroupExpr(*elem, context, &type);
        buffer.push_back(&expr);
    }

    auto& comp = context.getCompilation();
    items = buffer.copy(comp);

    if (syntax.repeat) {
        switch (syntax.repeat->specifier.kind) {
            case TokenKind::Star:
                repeatKind = Consecutive;
                break;
            case TokenKind::Equals:
                repeatKind = Nonconsecutive;
                break;
            case TokenKind::MinusArrow:
                repeatKind = GoTo;
                break;
            default:
                SLANG_UNREACHABLE;
        }

        auto bindCount = [&](const ExpressionSyntax& exprSyntax) {
            auto& expr = bindCovergroupExpr(exprSyntax, context);
            context.requireIntegral(expr);
            return &expr;
        };

        if (auto sel = syntax.repeat->selector) {
            if (sel->kind == SyntaxKind::BitSelect) {
                repeatFrom = bindCount(*sel->as<BitSelectSyntax>().expr);
            }
            else {
                auto& rss = sel->as<RangeSelectSyntax>();
                repeatFrom = bindCount(*rss.left);
                repeatTo = bindCount(*rss.right);
            }
        }
    }
}